

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O1

string * testing::internal::JoinAsTuple(string *__return_storage_ptr__,Strings *fields)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  
  __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)fields;
  lVar2 = *(long *)(fields + 8) - (long)__rhs >> 5;
  if (lVar2 == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (__rhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + __rhs->_M_string_length);
  }
  else if (lVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::operator+(__return_storage_ptr__,"(",__rhs);
    if (0x20 < (ulong)(*(long *)(fields + 8) - *(long *)fields)) {
      uVar3 = 1;
      lVar2 = 0x28;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,", ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,*(char **)(*(long *)fields + -8 + lVar2),
                   *(size_type *)(*(long *)fields + lVar2));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x20;
      } while (uVar3 < (ulong)(*(long *)(fields + 8) - *(long *)fields >> 5));
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,")");
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string JoinAsTuple(const Strings& fields) {
  switch (fields.size()) {
    case 0:
      return "";
    case 1:
      return fields[0];
    default:
      std::string result = "(" + fields[0];
      for (size_t i = 1; i < fields.size(); i++) {
        result += ", ";
        result += fields[i];
      }
      result += ")";
      return result;
  }
}